

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnTableCopy(SharedValidator *this,Location *loc,Var *dst_var,Var *src_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  TableType src_table;
  TableType dst_table;
  TableType local_108;
  TableType local_e8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0xd5,loc);
  local_e8.limits.max._0_3_ = 0;
  local_e8.limits._11_8_ = 0;
  local_e8.element.enum_ = Any;
  local_e8.element.type_index_ = 0;
  local_e8.limits.initial._0_3_ = 0;
  local_e8.limits.initial._3_5_ = 0;
  local_108.limits.max._0_3_ = 0;
  local_108.limits._11_8_ = 0;
  local_108.element.enum_ = Any;
  local_108.element.type_index_ = 0;
  local_108.limits.initial._0_3_ = 0;
  local_108.limits.initial._3_5_ = 0;
  Var::Var(&local_78,dst_var);
  RVar2 = CheckTableIndex(this,&local_78,&local_e8);
  Var::~Var(&local_78);
  Var::Var(&local_c0,src_var);
  RVar3 = CheckTableIndex(this,&local_c0,&local_108);
  Var::~Var(&local_c0);
  RVar4 = TypeChecker::OnTableCopy(&this->typechecker_,&local_e8.limits,&local_108.limits);
  RVar5 = CheckType(this,loc,local_108.element,local_e8.element,"table.copy");
  RVar1.enum_._0_1_ =
       RVar5.enum_ == Error ||
       ((RVar4.enum_ == Error || RVar3.enum_ == Error) ||
       (RVar2.enum_ == Error || RVar1.enum_ == Error));
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableCopy(const Location& loc,
                                    Var dst_var,
                                    Var src_var) {
  Result result = CheckInstr(Opcode::TableCopy, loc);
  TableType dst_table;
  TableType src_table;
  result |= CheckTableIndex(dst_var, &dst_table);
  result |= CheckTableIndex(src_var, &src_table);
  result |= typechecker_.OnTableCopy(dst_table.limits, src_table.limits);
  result |= CheckType(loc, src_table.element, dst_table.element, "table.copy");
  return result;
}